

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O1

void __thiscall
helics::apps::Source::linkPublicationToGenerator(Source *this,string_view key,int genIndex)

{
  size_type sVar1;
  iterator iVar2;
  HelicsException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Elt_pointer pSVar6;
  string_view message;
  size_type *local_78;
  size_type local_68;
  undefined8 uStack_60;
  key_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_58._M_str = key._M_str;
  local_58._M_len = key._M_len;
  iVar2 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->pubids)._M_t,&local_58);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->pubids)._M_t._M_impl.super__Rb_tree_header) {
    pSVar6 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar4 = ((long)pSVar6 -
             (long)(this->sources).
                   super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 8) +
            (long)*(int *)&iVar2._M_node[1]._M_left;
    if (uVar4 < 2) {
      pSVar6 = pSVar6 + *(int *)&iVar2._M_node[1]._M_left;
    }
    else {
      pSVar6 = (this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar4 >> 1] +
               uVar4 + (uVar4 >> 1) * -2;
    }
    pSVar6->generatorIndex = genIndex;
    return;
  }
  this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,local_58._M_str,local_58._M_str + local_58._M_len);
  pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_48," was not recognized as a valid publication");
  local_78 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78 == paVar5) {
    local_68 = paVar5->_M_allocated_capacity;
    uStack_60 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_78 = &local_68;
  }
  else {
    local_68 = paVar5->_M_allocated_capacity;
  }
  sVar1 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  message._M_str = (char *)local_78;
  message._M_len = sVar1;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_00522bc0;
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Source::linkPublicationToGenerator(std::string_view key, int genIndex)
    {
        auto fnd = pubids.find(key);
        if (fnd == pubids.end()) {
            // only get here if something wasn't found
            throw(
                InvalidParameter(std::string(key) + " was not recognized as a valid publication"));
        }
        sources[fnd->second].generatorIndex = genIndex;
    }